

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

Map * __thiscall flexbuffers::Reference::AsMap(Map *__return_storage_ptr__,Reference *this)

{
  byte bVar1;
  ulong *puVar2;
  ulong uVar3;
  uint8_t *puVar4;
  long lVar5;
  
  if (this->type_ == FBT_MAP) {
    puVar2 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar3 = (ulong)(byte)*puVar2;
      }
      else {
        uVar3 = (ulong)(ushort)*puVar2;
      }
    }
    else if (bVar1 < 8) {
      uVar3 = (ulong)(uint)*puVar2;
    }
    else {
      uVar3 = *puVar2;
    }
    puVar4 = (uint8_t *)((long)puVar2 - uVar3);
    bVar1 = this->byte_width_;
    lVar5 = -(ulong)bVar1;
    (__return_storage_ptr__->super_Vector).super_Sized.super_Object.data_ = puVar4;
    (__return_storage_ptr__->super_Vector).super_Sized.super_Object.byte_width_ = bVar1;
    if ((ulong)bVar1 < 4) {
      if (bVar1 < 2) {
        uVar3 = (ulong)puVar4[lVar5];
      }
      else {
        uVar3 = (ulong)*(ushort *)(puVar4 + lVar5);
      }
    }
    else if (bVar1 < 8) {
      uVar3 = (ulong)*(uint *)(puVar4 + lVar5);
    }
    else {
      uVar3 = *(ulong *)(puVar4 + lVar5);
    }
  }
  else {
    (__return_storage_ptr__->super_Vector).super_Sized.super_Object.data_ = "";
    (__return_storage_ptr__->super_Vector).super_Sized.super_Object.byte_width_ = '\x01';
    uVar3 = 0;
  }
  (__return_storage_ptr__->super_Vector).super_Sized.size_ = uVar3;
  return __return_storage_ptr__;
}

Assistant:

Map AsMap() const {
    if (type_ == FBT_MAP) {
      return Map(Indirect(), byte_width_);
    } else {
      return Map::EmptyMap();
    }
  }